

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

ItemFlags __thiscall QFileSystemModel::flags(QFileSystemModel *this,QModelIndex *index)

{
  QFileSystemModelPrivate *this_00;
  QFileSystemNode *node;
  Data *pDVar1;
  bool bVar2;
  QFlagsStorageHelper<Qt::ItemFlag,_4> QVar3;
  Type TVar4;
  uint uVar5;
  QFlagsStorage<Qt::ItemFlag> QVar6;
  
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  QVar3.super_QFlagsStorage<Qt::ItemFlag>.i =
       (QFlagsStorage<Qt::ItemFlag>)QAbstractItemModel::flags((QModelIndex *)this);
  if (index->r < 0) {
    return (ItemFlags)(Int)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i;
  }
  if (index->c < 0) {
    return (ItemFlags)(Int)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i;
  }
  if ((index->m).ptr == (QAbstractItemModel *)0x0) {
    return (ItemFlags)(Int)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i;
  }
  node = (QFileSystemNode *)index->i;
  if ((this_00->nameFilterDisables == true) &&
     (bVar2 = QFileSystemModelPrivate::passNameFilters(this_00,node), !bVar2)) {
    return (ItemFlags)((uint)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i & 0xffffffdf);
  }
  QVar6.i = (uint)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i | 4;
  if (node->info == (QExtendedInformation *)0x0) {
    pDVar1 = (node->children).d;
    if ((pDVar1 != (Data *)0x0) && (0 < (long)pDVar1->size)) goto LAB_00612f73;
  }
  else {
    TVar4 = QExtendedInformation::type(node->info);
    if (TVar4 == Dir) goto LAB_00612f73;
  }
  QVar6.i = (uint)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i | 0x84;
LAB_00612f73:
  if ((((this_00->readOnly == false) && (index->c == 0)) &&
      (node->info != (QExtendedInformation *)0x0)) &&
     (uVar5 = QFileInfo::permissions(), (uVar5 >> 9 & 1) != 0)) {
    QVar3.super_QFlagsStorage<Qt::ItemFlag>.i = (QFlagsStorage<Qt::ItemFlag>)(QVar6.i | 2);
    if (node->info == (QExtendedInformation *)0x0) {
      pDVar1 = (node->children).d;
      if (pDVar1 == (Data *)0x0) {
        return (ItemFlags)(Int)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i;
      }
      if ((long)pDVar1->size < 1) {
        return (ItemFlags)(Int)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i;
      }
    }
    else {
      TVar4 = QExtendedInformation::type(node->info);
      if (TVar4 != Dir) {
        return (ItemFlags)(Int)QVar3.super_QFlagsStorage<Qt::ItemFlag>.i;
      }
    }
    QVar6.i = QVar6.i | 10;
  }
  return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar6.i;
}

Assistant:

Qt::ItemFlags QFileSystemModel::flags(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    Qt::ItemFlags flags = QAbstractItemModel::flags(index);
    if (!index.isValid())
        return flags;

    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(index);
    if (d->nameFilterDisables && !d->passNameFilters(indexNode)) {
        flags &= ~Qt::ItemIsEnabled;
        // ### TODO you shouldn't be able to set this as the current item, task 119433
        return flags;
    }

    flags |= Qt::ItemIsDragEnabled;

    if (!indexNode->isDir())
        flags |= Qt::ItemNeverHasChildren;
    if (d->readOnly)
        return flags;
    if ((index.column() == 0) && indexNode->permissions() & QFile::WriteUser) {
        flags |= Qt::ItemIsEditable;
        if (indexNode->isDir())
            flags |= Qt::ItemIsDropEnabled;
    }
    return flags;
}